

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O1

void ZmqContextManager::closeContext(string *contextName)

{
  int iVar1;
  iterator __position;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&contextLock);
  if (iVar1 == 0) {
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>_>
                 ::find(&contexts_abi_cxx11_._M_t,contextName);
    if ((_Rb_tree_header *)__position._M_node !=
        &contexts_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>_>
      ::_M_erase_aux(&contexts_abi_cxx11_._M_t,(const_iterator)__position._M_node);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&contextLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ZmqContextManager::closeContext(const std::string& contextName)
{
    std::lock_guard<std::mutex> conlock(contextLock);
    auto fnd = contexts.find(contextName);
    if (fnd != contexts.end()) {
        contexts.erase(fnd);
    }
}